

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O0

void __thiscall Assimp::IFC::Schema_2x3::IfcTextLiteral::~IfcTextLiteral(IfcTextLiteral *this)

{
  ~IfcTextLiteral((IfcTextLiteral *)((long)&this[-1].Path.field_2 + 8));
  return;
}

Assistant:

IfcTextLiteral() : Object("IfcTextLiteral") {}